

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O0

h__Reader * __thiscall
ASDCP::TimedText::MXFReader::h__Reader::ReadAncillaryResource
          (h__Reader *this,byte_t *uuid,FrameBuffer *frame_buf,AESDecContext *Ctx,HMACContext *HMAC)

{
  bool bVar1;
  int iVar2;
  ILogSink *pIVar3;
  char *pcVar4;
  reference ppVar5;
  byte_t *local_1a0;
  undefined1 local_150 [112];
  TimedTextResourceSubDescriptor *desc_object;
  long local_d8;
  InterchangeObject *tmp_iobj;
  char local_c8 [8];
  char buf [64];
  _Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_> local_80 [3];
  iterator local_68;
  _Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_> local_60;
  const_iterator ri;
  UUID RID;
  HMACContext *HMAC_local;
  AESDecContext *Ctx_local;
  FrameBuffer *frame_buf_local;
  byte_t *uuid_local;
  h__Reader *this_local;
  Result_t *result;
  
  if (frame_buf == (FrameBuffer *)0x0) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar3,"NULL pointer in file %s, line %d\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
               ,0x101);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    Kumu::UUID::UUID((UUID *)&ri,(byte_t *)frame_buf);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
         ::find((map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
                 *)(uuid + 0x660),(UUID *)&ri);
    std::_Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>::_Rb_tree_const_iterator
              (&local_60,&local_68);
    buf._56_8_ = std::
                 map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
                 ::end((map<Kumu::UUID,_Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>_>
                        *)(uuid + 0x660));
    std::_Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>::_Rb_tree_const_iterator
              (local_80,(iterator *)(buf + 0x38));
    bVar1 = std::operator==(&local_60,local_80);
    if (bVar1) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar4 = Kumu::UUID::EncodeHex((UUID *)&ri,local_c8,0x40);
      Kumu::ILogSink::Error(pIVar3,"No such resource: %s\n",pcVar4);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_RANGE);
    }
    else {
      local_d8 = 0;
      desc_object._7_1_ = 0;
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_Kumu::UUID,_Kumu::UUID>_>::operator*
                         (&local_60);
      MXF::OP1aHeader::GetMDObjectByID
                ((OP1aHeader *)this,(UUID *)(uuid + 0x18),(InterchangeObject **)&ppVar5->second);
      if (local_d8 == 0) {
        local_1a0 = (byte_t *)0x0;
      }
      else {
        local_1a0 = (byte_t *)
                    __dynamic_cast(local_d8,&MXF::InterchangeObject::typeinfo,
                                   &MXF::TimedTextResourceSubDescriptor::typeinfo);
      }
      local_150._104_8_ = local_1a0;
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar2) {
        if ((byte_t *)local_150._104_8_ == (byte_t *)0x0) {
          __assert_fail("desc_object",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                        ,0x113,
                        "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const byte_t *, FrameBuffer &, AESDecContext *, HMACContext *)"
                       );
        }
        MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>::
        ReadGenericStreamPartitionPayload
                  ((TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *)
                   local_150,(ui32_t)uuid,(FrameBuffer *)(ulong)*(uint *)(local_150._104_8_ + 0xe8),
                   Ctx,HMAC);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_150);
        Kumu::Result_t::~Result_t((Result_t *)local_150);
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar2) {
        FrameBuffer::AssetID((FrameBuffer *)Ctx,(byte_t *)frame_buf);
        FrameBuffer::MIMEType((FrameBuffer *)Ctx,(string *)(local_150._104_8_ + 200));
      }
      desc_object._7_1_ = 1;
    }
    tmp_iobj._4_4_ = 1;
    Kumu::UUID::~UUID((UUID *)&ri);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::h__Reader::ReadAncillaryResource(const byte_t* uuid, FrameBuffer& frame_buf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  KM_TEST_NULL_L(uuid);
  UUID RID(uuid);

  ResourceMap_t::const_iterator ri = m_ResourceMap.find(RID);
  if ( ri == m_ResourceMap.end() )
    {
      char buf[64];
      DefaultLogSink().Error("No such resource: %s\n", RID.EncodeHex(buf, 64));
      return RESULT_RANGE;
    }

  // get the subdescriptor
  InterchangeObject* tmp_iobj = 0;
  Result_t result = m_HeaderPart.GetMDObjectByID((*ri).second, &tmp_iobj);
  TimedTextResourceSubDescriptor* desc_object = dynamic_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

  if ( KM_SUCCESS(result) )
    {
      assert(desc_object);
      result = ReadGenericStreamPartitionPayload(desc_object->EssenceStreamID, frame_buf, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      frame_buf.AssetID(uuid);
      frame_buf.MIMEType(desc_object->MIMEMediaType);
    }

  return result;
}